

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O0

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
t_enum::f_define(vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                 *__return_storage_ptr__,t_enum *this)

{
  t_define<t_enum> *this_00;
  t_object *local_68;
  wstring_view local_60;
  t_define<t_enum> local_50;
  t_enum *local_18;
  t_enum *this_local;
  
  local_18 = this;
  this_local = (t_enum *)__return_storage_ptr__;
  xemmai::t_define<t_enum>::t_define(&local_50,this);
  local_60 = sv(L"Number",6);
  local_68 = xemmai::t_type_of<t_number>::f_define(this);
  this_00 = xemmai::t_define<t_enum>::operator()(&local_50,local_60,&local_68);
  xemmai::t_define::operator_cast_to_vector(__return_storage_ptr__,(t_define *)this_00);
  xemmai::t_define<t_enum>::~t_define(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_enum::f_define()
{
	return t_define(this)
	(L"Number"sv, t_type_of<t_number>::f_define(this))
	;
}